

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

vector<wchar_t,_std::allocator<wchar_t>_> * __thiscall
RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::get_remainder
          (vector<wchar_t,_std::allocator<wchar_t>_> *__return_storage_ptr__,
          RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> *this,
          size_t in_times_split)

{
  (__return_storage_ptr__->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (in_times_split <
      (ulong)(((long)(this->m_tokens).
                     super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_tokens).
                    super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    std::vector<wchar_t,std::allocator<wchar_t>>::
    insert<__gnu_cxx::__normal_iterator<wchar_t*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
              ((vector<wchar_t,std::allocator<wchar_t>> *)__return_storage_ptr__,(const_iterator)0x0
               ,(__normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
                ((this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                 super__Vector_impl_data._M_start +
                (this->m_token_indexes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[in_times_split]),
               (__normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
               (this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		if (in_times_split < m_tokens.size()) {
			auto index = m_token_indexes[in_times_split];
			result.insert(result.end(), m_str.begin() + index, m_str.end());
		}

		return result;
	}